

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

type __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doCreateByKey<std::__cxx11::string_const&,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>>
          (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::FontFamily,std::default_delete<Rml::FontFamily>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  FontFamily *__n;
  __uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> __p;
  int iVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  type puVar10;
  string *this_00;
  ulong insertion_idx;
  uint uVar11;
  long *local_58 [2];
  long local_48 [2];
  __uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> local_38;
  
  do {
    sVar7 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,key);
    uVar11 = ((uint)sVar7 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar4 = *(int *)(this + 0x28);
    insertion_idx = sVar7 >> 5 & *(ulong *)(this + 0x18);
    lVar9 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar9 + insertion_idx);
    while( true ) {
      uVar11 = uVar11 + iVar4;
      if (bVar3 <= uVar11) break;
      bVar3 = *(byte *)(lVar9 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
    }
    if (uVar11 == bVar3) {
      pcVar5 = (key->_M_dataplus)._M_p;
      __n = (FontFamily *)key->_M_string_length;
      puVar10 = (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
      do {
        if (__n == puVar10[-3]._M_t.
                   super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
                   super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl) {
          if (__n == (FontFamily *)0x0) {
            return puVar10;
          }
          iVar6 = bcmp(pcVar5,puVar10[-4]._M_t.
                              super___uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>
                              .super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl,
                       (size_t)__n);
          if (iVar6 == 0) {
            return puVar10;
          }
        }
        uVar11 = uVar11 + iVar4;
        pbVar2 = (byte *)(lVar9 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        puVar10 = puVar10 + 5;
      } while (uVar11 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar4 + uVar11) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar8 = 1;
      do {
        lVar8 = lVar8 + -1;
        pcVar1 = (char *)(lVar9 + insertion_idx);
        lVar9 = lVar9 + 1;
      } while (*pcVar1 != '\0');
      this_00 = (string *)(insertion_idx * 0x28 + *(long *)this);
      if (lVar8 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar5 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(this_00,pcVar5,pcVar5 + key->_M_string_length);
        *(undefined8 *)(this_00 + 0x20) = 0;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar8,insertion_idx);
        local_58[0] = local_48;
        pcVar5 = (key->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,pcVar5,pcVar5 + key->_M_string_length);
        local_38._M_t.
        super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
        super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
             (tuple<Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)
             (_Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)0x0;
        std::__cxx11::string::operator=(this_00,(string *)local_58);
        __p._M_t.super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
        super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
             local_38._M_t.
             super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
             super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl;
        local_38._M_t.
        super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>.
        super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl =
             (tuple<Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)
             (_Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>)0x0;
        std::__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::reset
                  ((__uniq_ptr_impl<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                   (this_00 + 0x20),
                   (pointer)__p._M_t.
                            super__Tuple_impl<0UL,_Rml::FontFamily_*,_std::default_delete<Rml::FontFamily>_>
                            .super__Head_base<0UL,_Rml::FontFamily_*,_false>._M_head_impl);
        std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::~unique_ptr
                  ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)&local_38);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar11;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      return (type)(*(long *)this + insertion_idx * 0x28 + 0x20);
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }